

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O2

short * vrna_seq_encode(char *sequence,vrna_md_t *md)

{
  short *psVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (md == (vrna_md_t *)0x0 || sequence == (char *)0x0) {
    psVar1 = (short *)0x0;
  }
  else {
    psVar1 = vrna_seq_encode_simple(sequence,md);
    sVar2 = strlen(sequence);
    for (uVar3 = 1; uVar3 <= (sVar2 & 0xffffffff); uVar3 = uVar3 + 1) {
      psVar1[uVar3] = md->alias[psVar1[uVar3]];
    }
    psVar1[(int)sVar2 + 1] = psVar1[1];
    *psVar1 = psVar1[sVar2 & 0xffffffff];
  }
  return psVar1;
}

Assistant:

PUBLIC short *
vrna_seq_encode(const char  *sequence,
                vrna_md_t   *md)
{
  unsigned int  i, l;
  short         *S = NULL;

  if (sequence && md) {
    S = vrna_seq_encode_simple(sequence, md);

    l = (unsigned int)strlen(sequence);

    for (i = 1; i <= l; i++)
      S[i] = md->alias[S[i]];

    S[l + 1]  = S[1];
    S[0]      = S[l];
  }

  return S;
}